

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

void kv_set_var_nentry_update_test(btree_kv_ops *kv_ops)

{
  code *pcVar1;
  undefined8 uVar2;
  int iVar3;
  bnode *__ptr;
  size_t sVar4;
  void *pvVar5;
  char **ppcVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  char **ppcVar10;
  char *apcStack_c0 [13];
  undefined1 local_58 [8];
  timeval __test_begin;
  char local_31 [8];
  uint8_t v;
  
  __test_begin.tv_usec = (__suseconds_t)kv_ops;
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  memleak_start();
  __ptr = dummy_node('\b','\x01',1);
  __ptr->nentry = 10;
  local_31[0] = 'd';
  uVar7 = 0;
  lVar8 = 0;
  ppcVar6 = apcStack_c0 + 3;
  do {
    if (uVar7 == 10) {
      uVar7 = 0;
      lVar8 = 0;
      do {
        pcVar1 = *(code **)(__test_begin.tv_usec + 8);
        if (uVar7 == 10) {
          ppcVar10 = apcStack_c0 + 3;
          *(char *)((long)ppcVar6 + -8) = '\t';
          *(char *)((long)ppcVar6 + -7) = '\0';
          *(char *)((long)ppcVar6 + -6) = '\0';
          *(char *)((long)ppcVar6 + -5) = '\0';
          *(char *)((long)ppcVar6 + -4) = '\0';
          *(char *)((long)ppcVar6 + -3) = '\0';
          *(char *)((long)ppcVar6 + -2) = '\0';
          *(char *)((long)ppcVar6 + -1) = '\0';
          uVar2 = *(undefined8 *)((long)ppcVar6 + -8);
          *(char *)((long)ppcVar6 + -8) = -0x23;
          *(char *)((long)ppcVar6 + -7) = '\x1b';
          *(char *)((long)ppcVar6 + -6) = '\x10';
          *(char *)((long)ppcVar6 + -5) = '\0';
          *(char *)((long)ppcVar6 + -4) = '\0';
          *(char *)((long)ppcVar6 + -3) = '\0';
          *(char *)((long)ppcVar6 + -2) = '\0';
          *(char *)((long)ppcVar6 + -1) = '\0';
          (*pcVar1)(__ptr,uVar2,apcStack_c0[3],local_31);
          *(char *)((long)ppcVar6 + -8) = -0x14;
          *(char *)((long)ppcVar6 + -7) = '\x1b';
          *(char *)((long)ppcVar6 + -6) = '\x10';
          *(char *)((long)ppcVar6 + -5) = '\0';
          *(char *)((long)ppcVar6 + -4) = '\0';
          *(char *)((long)ppcVar6 + -3) = '\0';
          *(char *)((long)ppcVar6 + -2) = '\0';
          *(char *)((long)ppcVar6 + -1) = '\0';
          strcpy(apcStack_c0[3],apcStack_c0[0xc]);
          pcVar1 = *(code **)(__test_begin.tv_usec + 8);
          *(char *)((long)ppcVar6 + -8) = -2;
          *(char *)((long)ppcVar6 + -7) = '\x1b';
          *(char *)((long)ppcVar6 + -6) = '\x10';
          *(char *)((long)ppcVar6 + -5) = '\0';
          *(char *)((long)ppcVar6 + -4) = '\0';
          *(char *)((long)ppcVar6 + -3) = '\0';
          *(char *)((long)ppcVar6 + -2) = '\0';
          *(char *)((long)ppcVar6 + -1) = '\0';
          (*pcVar1)(__ptr,0,apcStack_c0[0xc],local_31);
          builtin_strncpy(apcStack_c0[0xc],"key0",5);
          lVar8 = 0;
          do {
            if (lVar8 == 0x5a) {
              builtin_strncpy((char *)((long)ppcVar6 + -8),"\x14\x1d\x10",4);
              *(char *)((long)ppcVar6 + -4) = '\0';
              *(char *)((long)ppcVar6 + -3) = '\0';
              *(char *)((long)ppcVar6 + -2) = '\0';
              *(char *)((long)ppcVar6 + -1) = '\0';
              free(__ptr);
              builtin_strncpy((char *)((long)ppcVar6 + -8),"\x19\x1d\x10",4);
              *(char *)((long)ppcVar6 + -4) = '\0';
              *(char *)((long)ppcVar6 + -3) = '\0';
              *(char *)((long)ppcVar6 + -2) = '\0';
              *(char *)((long)ppcVar6 + -1) = '\0';
              memleak_end();
              pcVar9 = "%s PASSED\n";
              if (kv_set_var_nentry_update_test(btree_kv_ops*)::__test_pass != '\0') {
                pcVar9 = "%s FAILED\n";
              }
              builtin_strncpy((char *)((long)ppcVar6 + -8),"J\x1d\x10",4);
              *(char *)((long)ppcVar6 + -4) = '\0';
              *(char *)((long)ppcVar6 + -3) = '\0';
              *(char *)((long)ppcVar6 + -2) = '\0';
              *(char *)((long)ppcVar6 + -1) = '\0';
              fprintf(_stderr,pcVar9,"kv_set_var_nentry_update_test");
              return;
            }
            pvVar5 = (__ptr->field_4).data;
            pcVar9 = *ppcVar10;
            builtin_strncpy((char *)((long)ppcVar6 + -8),"/\x1c\x10",4);
            *(char *)((long)ppcVar6 + -4) = '\0';
            *(char *)((long)ppcVar6 + -3) = '\0';
            *(char *)((long)ppcVar6 + -2) = '\0';
            *(char *)((long)ppcVar6 + -1) = '\0';
            sVar4 = strlen(pcVar9);
            builtin_strncpy((char *)((long)ppcVar6 + -8),"=\x1c\x10",4);
            *(char *)((long)ppcVar6 + -4) = '\0';
            *(char *)((long)ppcVar6 + -3) = '\0';
            *(char *)((long)ppcVar6 + -2) = '\0';
            *(char *)((long)ppcVar6 + -1) = '\0';
            iVar3 = bcmp((void *)((long)pvVar5 + lVar8),pcVar9,sVar4);
            if (iVar3 != 0) {
              builtin_strncpy((char *)((long)ppcVar6 + -8),"y\x1c\x10",4);
              *(char *)((long)ppcVar6 + -4) = '\0';
              *(char *)((long)ppcVar6 + -3) = '\0';
              *(char *)((long)ppcVar6 + -2) = '\0';
              *(char *)((long)ppcVar6 + -1) = '\0';
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0xec);
              kv_set_var_nentry_update_test(btree_kv_ops*)::__test_pass = '\x01';
              pvVar5 = (__ptr->field_4).data;
              *(char *)((long)ppcVar6 + -8) = -0x6c;
              *(char *)((long)ppcVar6 + -7) = '\x1c';
              *(char *)((long)ppcVar6 + -6) = '\x10';
              *(char *)((long)ppcVar6 + -5) = '\0';
              *(char *)((long)ppcVar6 + -4) = '\0';
              *(char *)((long)ppcVar6 + -3) = '\0';
              *(char *)((long)ppcVar6 + -2) = '\0';
              *(char *)((long)ppcVar6 + -1) = '\0';
              sVar4 = strlen(pcVar9);
              *(char *)((long)ppcVar6 + -8) = -0x5e;
              *(char *)((long)ppcVar6 + -7) = '\x1c';
              *(char *)((long)ppcVar6 + -6) = '\x10';
              *(char *)((long)ppcVar6 + -5) = '\0';
              *(char *)((long)ppcVar6 + -4) = '\0';
              *(char *)((long)ppcVar6 + -3) = '\0';
              *(char *)((long)ppcVar6 + -2) = '\0';
              *(char *)((long)ppcVar6 + -1) = '\0';
              iVar3 = bcmp((void *)((long)pvVar5 + lVar8),pcVar9,sVar4);
              if (iVar3 != 0) {
                *(code **)((long)ppcVar6 + -8) = kv_get_var_test;
                __assert_fail("!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i]))",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                              ,0xec,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
              }
            }
            if (*(char *)((long)pvVar5 + lVar8 + 8) != local_31[0]) {
              *(char *)((long)ppcVar6 + -8) = -0x31;
              *(char *)((long)ppcVar6 + -7) = '\x1c';
              *(char *)((long)ppcVar6 + -6) = '\x10';
              *(char *)((long)ppcVar6 + -5) = '\0';
              *(char *)((long)ppcVar6 + -4) = '\0';
              *(char *)((long)ppcVar6 + -3) = '\0';
              *(char *)((long)ppcVar6 + -2) = '\0';
              *(char *)((long)ppcVar6 + -1) = '\0';
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0xee);
              kv_set_var_nentry_update_test(btree_kv_ops*)::__test_pass = '\x01';
              if (*(char *)((__ptr->field_4).dummy + 8 + lVar8) != local_31[0]) {
                builtin_strncpy((char *)((long)ppcVar6 + -8),"\v\x1d\x10",4);
                *(char *)((long)ppcVar6 + -4) = '\0';
                *(char *)((long)ppcVar6 + -3) = '\0';
                *(char *)((long)ppcVar6 + -2) = '\0';
                *(char *)((long)ppcVar6 + -1) = '\0';
                __assert_fail("!memcmp((uint8_t *)node->data + offset, &v, vsize)",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                              ,0xee,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
              }
            }
            lVar8 = lVar8 + 9;
            ppcVar10 = ppcVar10 + 1;
          } while( true );
        }
        pcVar9 = apcStack_c0[uVar7 + 3];
        *(char *)((long)ppcVar6 + -8) = -0x2e;
        *(char *)((long)ppcVar6 + -7) = '\x1a';
        *(char *)((long)ppcVar6 + -6) = '\x10';
        *(char *)((long)ppcVar6 + -5) = '\0';
        *(char *)((long)ppcVar6 + -4) = '\0';
        *(char *)((long)ppcVar6 + -3) = '\0';
        *(char *)((long)ppcVar6 + -2) = '\0';
        *(char *)((long)ppcVar6 + -1) = '\0';
        (*pcVar1)(__ptr,uVar7 & 0xffff,pcVar9,local_31);
        pvVar5 = (__ptr->field_4).data;
        *(char *)((long)ppcVar6 + -8) = -0x1e;
        *(char *)((long)ppcVar6 + -7) = '\x1a';
        *(char *)((long)ppcVar6 + -6) = '\x10';
        *(char *)((long)ppcVar6 + -5) = '\0';
        *(char *)((long)ppcVar6 + -4) = '\0';
        *(char *)((long)ppcVar6 + -3) = '\0';
        *(char *)((long)ppcVar6 + -2) = '\0';
        *(char *)((long)ppcVar6 + -1) = '\0';
        sVar4 = strlen(pcVar9);
        *(char *)((long)ppcVar6 + -8) = -0x10;
        *(char *)((long)ppcVar6 + -7) = '\x1a';
        *(char *)((long)ppcVar6 + -6) = '\x10';
        *(char *)((long)ppcVar6 + -5) = '\0';
        *(char *)((long)ppcVar6 + -4) = '\0';
        *(char *)((long)ppcVar6 + -3) = '\0';
        *(char *)((long)ppcVar6 + -2) = '\0';
        *(char *)((long)ppcVar6 + -1) = '\0';
        iVar3 = bcmp((void *)((long)pvVar5 + lVar8),pcVar9,sVar4);
        if (iVar3 != 0) {
          builtin_strncpy((char *)((long)ppcVar6 + -8),"+\x1b\x10",4);
          *(char *)((long)ppcVar6 + -4) = '\0';
          *(char *)((long)ppcVar6 + -3) = '\0';
          *(char *)((long)ppcVar6 + -2) = '\0';
          *(char *)((long)ppcVar6 + -1) = '\0';
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0xd9);
          kv_set_var_nentry_update_test(btree_kv_ops*)::__test_pass = '\x01';
          pvVar5 = (__ptr->field_4).data;
          builtin_strncpy((char *)((long)ppcVar6 + -8),"F\x1b\x10",4);
          *(char *)((long)ppcVar6 + -4) = '\0';
          *(char *)((long)ppcVar6 + -3) = '\0';
          *(char *)((long)ppcVar6 + -2) = '\0';
          *(char *)((long)ppcVar6 + -1) = '\0';
          sVar4 = strlen(pcVar9);
          builtin_strncpy((char *)((long)ppcVar6 + -8),"T\x1b\x10",4);
          *(char *)((long)ppcVar6 + -4) = '\0';
          *(char *)((long)ppcVar6 + -3) = '\0';
          *(char *)((long)ppcVar6 + -2) = '\0';
          *(char *)((long)ppcVar6 + -1) = '\0';
          iVar3 = bcmp((void *)((long)pvVar5 + lVar8),pcVar9,sVar4);
          if (iVar3 != 0) {
            *(char *)((long)ppcVar6 + -8) = -0x69;
            *(char *)((long)ppcVar6 + -7) = '\x1d';
            *(char *)((long)ppcVar6 + -6) = '\x10';
            *(char *)((long)ppcVar6 + -5) = '\0';
            *(char *)((long)ppcVar6 + -4) = '\0';
            *(char *)((long)ppcVar6 + -3) = '\0';
            *(char *)((long)ppcVar6 + -2) = '\0';
            *(char *)((long)ppcVar6 + -1) = '\0';
            __assert_fail("!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i]))",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                          ,0xd9,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
          }
        }
        if (*(char *)((long)pvVar5 + lVar8 + 8) != local_31[0]) {
          *(char *)((long)ppcVar6 + -8) = -0x7f;
          *(char *)((long)ppcVar6 + -7) = '\x1b';
          *(char *)((long)ppcVar6 + -6) = '\x10';
          *(char *)((long)ppcVar6 + -5) = '\0';
          *(char *)((long)ppcVar6 + -4) = '\0';
          *(char *)((long)ppcVar6 + -3) = '\0';
          *(char *)((long)ppcVar6 + -2) = '\0';
          *(char *)((long)ppcVar6 + -1) = '\0';
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0xdb);
          kv_set_var_nentry_update_test(btree_kv_ops*)::__test_pass = '\x01';
          if (*(char *)((__ptr->field_4).dummy + 8 + lVar8) != local_31[0]) {
            *(char *)((long)ppcVar6 + -8) = -0x43;
            *(char *)((long)ppcVar6 + -7) = '\x1b';
            *(char *)((long)ppcVar6 + -6) = '\x10';
            *(char *)((long)ppcVar6 + -5) = '\0';
            *(char *)((long)ppcVar6 + -4) = '\0';
            *(char *)((long)ppcVar6 + -3) = '\0';
            *(char *)((long)ppcVar6 + -2) = '\0';
            *(char *)((long)ppcVar6 + -1) = '\0';
            __assert_fail("!memcmp((uint8_t *)node->data + offset, &v, vsize)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                          ,0xdb,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
          }
        }
        lVar8 = lVar8 + 9;
        uVar7 = uVar7 + 1;
      } while( true );
    }
    pcVar9 = (char *)((long)ppcVar6 + -0x10);
    apcStack_c0[uVar7 + 3] = pcVar9;
    *(char *)((long)ppcVar6 + -0x18) = -0x66;
    *(char *)((long)ppcVar6 + -0x17) = '\x19';
    *(char *)((long)ppcVar6 + -0x16) = '\x10';
    *(char *)((long)ppcVar6 + -0x15) = '\0';
    *(char *)((long)ppcVar6 + -0x14) = '\0';
    *(char *)((long)ppcVar6 + -0x13) = '\0';
    *(char *)((long)ppcVar6 + -0x12) = '\0';
    *(char *)((long)ppcVar6 + -0x11) = '\0';
    sprintf(pcVar9,"key%d",uVar7 & 0xffffffff);
    pcVar1 = *(code **)(__test_begin.tv_usec + 8);
    *(char *)((long)ppcVar6 + -0x18) = -0x4d;
    *(char *)((long)ppcVar6 + -0x17) = '\x19';
    *(char *)((long)ppcVar6 + -0x16) = '\x10';
    *(char *)((long)ppcVar6 + -0x15) = '\0';
    *(char *)((long)ppcVar6 + -0x14) = '\0';
    *(char *)((long)ppcVar6 + -0x13) = '\0';
    *(char *)((long)ppcVar6 + -0x12) = '\0';
    *(char *)((long)ppcVar6 + -0x11) = '\0';
    (*pcVar1)(__ptr,uVar7 & 0xffff,pcVar9,local_31);
    pvVar5 = (__ptr->field_4).data;
    *(char *)((long)ppcVar6 + -0x18) = -0x3d;
    *(char *)((long)ppcVar6 + -0x17) = '\x19';
    *(char *)((long)ppcVar6 + -0x16) = '\x10';
    *(char *)((long)ppcVar6 + -0x15) = '\0';
    *(char *)((long)ppcVar6 + -0x14) = '\0';
    *(char *)((long)ppcVar6 + -0x13) = '\0';
    *(char *)((long)ppcVar6 + -0x12) = '\0';
    *(char *)((long)ppcVar6 + -0x11) = '\0';
    sVar4 = strlen(pcVar9);
    *(char *)((long)ppcVar6 + -0x18) = -0x2f;
    *(char *)((long)ppcVar6 + -0x17) = '\x19';
    *(char *)((long)ppcVar6 + -0x16) = '\x10';
    *(char *)((long)ppcVar6 + -0x15) = '\0';
    *(char *)((long)ppcVar6 + -0x14) = '\0';
    *(char *)((long)ppcVar6 + -0x13) = '\0';
    *(char *)((long)ppcVar6 + -0x12) = '\0';
    *(char *)((long)ppcVar6 + -0x11) = '\0';
    iVar3 = bcmp((void *)((long)pvVar5 + lVar8),pcVar9,sVar4);
    if (iVar3 != 0) {
      builtin_strncpy((char *)((long)ppcVar6 + -0x18),"\f\x1a\x10",4);
      *(char *)((long)ppcVar6 + -0x14) = '\0';
      *(char *)((long)ppcVar6 + -0x13) = '\0';
      *(char *)((long)ppcVar6 + -0x12) = '\0';
      *(char *)((long)ppcVar6 + -0x11) = '\0';
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0xcc);
      kv_set_var_nentry_update_test(btree_kv_ops*)::__test_pass = '\x01';
      pvVar5 = (__ptr->field_4).data;
      builtin_strncpy((char *)((long)ppcVar6 + -0x18),"\'\x1a\x10",4);
      *(char *)((long)ppcVar6 + -0x14) = '\0';
      *(char *)((long)ppcVar6 + -0x13) = '\0';
      *(char *)((long)ppcVar6 + -0x12) = '\0';
      *(char *)((long)ppcVar6 + -0x11) = '\0';
      sVar4 = strlen(pcVar9);
      builtin_strncpy((char *)((long)ppcVar6 + -0x18),"5\x1a\x10",4);
      *(char *)((long)ppcVar6 + -0x14) = '\0';
      *(char *)((long)ppcVar6 + -0x13) = '\0';
      *(char *)((long)ppcVar6 + -0x12) = '\0';
      *(char *)((long)ppcVar6 + -0x11) = '\0';
      iVar3 = bcmp((void *)((long)pvVar5 + lVar8),pcVar9,sVar4);
      if (iVar3 != 0) {
        builtin_strncpy((char *)((long)ppcVar6 + -0x18),"x\x1d\x10",4);
        *(char *)((long)ppcVar6 + -0x14) = '\0';
        *(char *)((long)ppcVar6 + -0x13) = '\0';
        *(char *)((long)ppcVar6 + -0x12) = '\0';
        *(char *)((long)ppcVar6 + -0x11) = '\0';
        __assert_fail("!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i]))",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0xcc,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
      }
    }
    if (*(char *)((long)pvVar5 + lVar8 + 8) != local_31[0]) {
      builtin_strncpy((char *)((long)ppcVar6 + -0x18),"b\x1a\x10",4);
      *(char *)((long)ppcVar6 + -0x14) = '\0';
      *(char *)((long)ppcVar6 + -0x13) = '\0';
      *(char *)((long)ppcVar6 + -0x12) = '\0';
      *(char *)((long)ppcVar6 + -0x11) = '\0';
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0xce);
      kv_set_var_nentry_update_test(btree_kv_ops*)::__test_pass = '\x01';
      if (*(char *)((__ptr->field_4).dummy + 8 + lVar8) != local_31[0]) {
        *(char *)((long)ppcVar6 + -0x18) = -0x62;
        *(char *)((long)ppcVar6 + -0x17) = '\x1a';
        *(char *)((long)ppcVar6 + -0x16) = '\x10';
        *(char *)((long)ppcVar6 + -0x15) = '\0';
        *(char *)((long)ppcVar6 + -0x14) = '\0';
        *(char *)((long)ppcVar6 + -0x13) = '\0';
        *(char *)((long)ppcVar6 + -0x12) = '\0';
        *(char *)((long)ppcVar6 + -0x11) = '\0';
        __assert_fail("!memcmp((uint8_t *)node->data + offset, &v, vsize)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0xce,"void kv_set_var_nentry_update_test(btree_kv_ops *)");
      }
    }
    lVar8 = lVar8 + 9;
    uVar7 = uVar7 + 1;
    ppcVar6 = (char **)pcVar9;
  } while( true );
}

Assistant:

void kv_set_var_nentry_update_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t v;
    int i, n = 10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    size_t offset = 0;
    char **key = alca(char*, n);

    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;

    // first pass
    for (i = 0; i < n; i++) {
        key[i] = alca(char, ksize);
        sprintf(key[i], "key%d", i);
        kv_ops->set_kv(node, i, key[i], (void *)&v);

        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;

    }

    offset = 0;

    // second pass
    for (i = 0; i < n; i++) {

        kv_ops->set_kv(node, i, key[i], (void *)&v);
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;
    }

    /* swap first/last entries */

    // copy first key to last
    kv_ops->set_kv(node, n-1, key[0], (void *)&v);
    strcpy(key[0], key[n-1]);

    // copy last key to first
    kv_ops->set_kv(node, 0, key[n-1], (void *)&v);
    strcpy(key[n-1], "key0");

    // verify
    offset = 0;
    for (i = 0; i < n; i++) {
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, key[i], strlen(key[i])));
        offset += ksize;
        TEST_CHK(!memcmp((uint8_t *)node->data + offset, &v, vsize));
        offset += vsize;
    }

    free(node);
    memleak_end();
    TEST_RESULT("kv_set_var_nentry_update_test");
}